

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseRAPass::_updateStackArgs(BaseRAPass *this)

{
  uint uVar1;
  FuncNode *pFVar2;
  RAWorkReg *pRVar3;
  undefined1 *puVar4;
  int iVar5;
  RAWorkReg **ppRVar6;
  FuncValue *pFVar7;
  ulong argIndex;
  size_t i;
  
  pFVar2 = this->_func;
  uVar1 = *(uint *)&this->field_0x148;
  i = 0;
  do {
    if (uVar1 == i) {
      return 0;
    }
    ppRVar6 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[](&this->_workRegs,i);
    pRVar3 = *ppRVar6;
    if (((byte)pRVar3[0x25] & 4) != 0) {
      argIndex = (ulong)(byte)pRVar3[0x48];
      if (argIndex == 0xff) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                   ,0x728,"workReg->hasArgIndex()");
      }
      puVar4 = *(undefined1 **)(pRVar3 + 0x18);
      if (puVar4 == (undefined1 *)0x0) {
        return 3;
      }
      if ((puVar4[2] & 2) == 0) {
        pFVar7 = FuncArgsAssignment::arg(&this->_argsAssignment,argIndex,(ulong)(byte)pRVar3[0x49]);
        pFVar7->_data = pFVar7->_data & 0xfff | *(int *)(puVar4 + 0x10) << 0xc;
      }
      else {
        pFVar7 = FuncDetail::arg(&this->_func->_funcDetail,argIndex,0);
        if (((pFVar2->_frame)._attributes & kHasPreservedFP) == kNoAttributes) {
          iVar5 = ((int)pFVar7->_data >> 0xc) + (pFVar2->_frame)._saOffsetFromSP;
        }
        else {
          *puVar4 = (char)(this->_fp).super_Operand.super_Operand_._baseId;
          iVar5 = ((int)pFVar7->_data >> 0xc) + (pFVar2->_frame)._saOffsetFromSA;
        }
        *(int *)(puVar4 + 0x10) = iVar5;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Error BaseRAPass::_updateStackArgs() noexcept {
  FuncFrame& frame = func()->frame();
  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      RAStackSlot* slot = workReg->stackSlot();

      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (slot->isStackArg()) {
        const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());
        if (frame.hasPreservedFP()) {
          slot->setBaseRegId(_fp.id());
          slot->setOffset(int32_t(frame.saOffsetFromSA()) + srcArg.stackOffset());
        }
        else {
          slot->setOffset(int32_t(frame.saOffsetFromSP()) + srcArg.stackOffset());
        }
      }
      else {
        FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
        dstArg.setStackOffset(slot->offset());
      }
    }
  }

  return kErrorOk;
}